

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe50At0(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = ((ulong)buf[2] |
          (ulong)buf[3] << 8 | (ulong)buf[4] << 0x10 | ((ulong)*(ushort *)(buf + 5) & 0x3ff) << 0x18
          ) << 0x10;
  uVar2 = *(ushort *)buf | uVar3;
  uVar1 = uVar2 | 0xfffc000000000000;
  if (uVar3 >> 0x31 == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe50At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[0];
    res &= UINT64_C(0x3ffffffffffff);

    if (res >> 49) {
        res |= UINT64_C(0xfffc000000000000);
    }

    return static_cast<std::int64_t>(res);
}